

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

void dictRelease(dict *ht)

{
  dict *ht_local;
  
  _dictClear(ht);
  free(ht);
  return;
}

Assistant:

static void dictRelease(dict *ht) {
    _dictClear(ht);
    free(ht);
}